

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3Fts3DeferredTokenList(Fts3DeferredToken *p,char **ppData,int *pnData)

{
  sqlite_int64 local_40;
  sqlite3_int64 dummy;
  void *pvStack_30;
  int nSkip;
  char *pRet;
  int *pnData_local;
  char **ppData_local;
  Fts3DeferredToken *p_local;
  
  *ppData = (char *)0x0;
  *pnData = 0;
  if (p->pList == (PendingList *)0x0) {
    p_local._4_4_ = 0;
  }
  else {
    pRet = (char *)pnData;
    pnData_local = (int *)ppData;
    ppData_local = (char **)p;
    pvStack_30 = sqlite3_malloc(p->pList->nData);
    if (pvStack_30 == (void *)0x0) {
      p_local._4_4_ = 7;
    }
    else {
      dummy._4_4_ = sqlite3Fts3GetVarint(*(char **)(ppData_local[3] + 8),&local_40);
      *(int *)pRet = *(int *)ppData_local[3] - dummy._4_4_;
      *(void **)pnData_local = pvStack_30;
      memcpy(pvStack_30,(void *)(*(long *)(ppData_local[3] + 8) + (long)dummy._4_4_),
             (long)*(int *)pRet);
      p_local._4_4_ = 0;
    }
  }
  return p_local._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3Fts3DeferredTokenList(
  Fts3DeferredToken *p, 
  char **ppData, 
  int *pnData
){
  char *pRet;
  int nSkip;
  sqlite3_int64 dummy;

  *ppData = 0;
  *pnData = 0;

  if( p->pList==0 ){
    return SQLITE_OK;
  }

  pRet = (char *)sqlite3_malloc(p->pList->nData);
  if( !pRet ) return SQLITE_NOMEM;

  nSkip = sqlite3Fts3GetVarint(p->pList->aData, &dummy);
  *pnData = p->pList->nData - nSkip;
  *ppData = pRet;
  
  memcpy(pRet, &p->pList->aData[nSkip], *pnData);
  return SQLITE_OK;
}